

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msa_helper.c
# Opt level: O0

void helper_msa_fmax_df_mips(CPUMIPSState *env,uint32_t df,uint32_t wd,uint32_t ws,uint32_t wt)

{
  int iVar1;
  float32 fVar2;
  uint uVar3;
  int iVar4;
  fpr_t *pfVar5;
  fpr_t *pfVar6;
  float_status *pfVar7;
  float64 fVar8;
  uintptr_t unaff_retaddr;
  int c_17;
  float_status *status_18;
  int c_16;
  float_status *status_17;
  int c_15;
  float_status *status_16;
  int c_14;
  float_status *status_15;
  int c_13;
  float_status *status_14;
  int c_12;
  float_status *status_13;
  int c_11;
  float_status *status_12;
  int c_10;
  float_status *status_11;
  int c_9;
  float_status *status_10;
  int c_8;
  float_status *status_9;
  int c_7;
  float_status *status_8;
  int c_6;
  float_status *status_7;
  int c_5;
  float_status *status_6;
  int c_4;
  float_status *status_5;
  int c_3;
  float_status *status_4;
  int c_2;
  float_status *status_3;
  int c_1;
  float_status *status_2;
  int c;
  float_status *status_1;
  wr_t *pwt;
  wr_t *pws;
  wr_t *pwd;
  wr_t *pwx;
  wr_t wx;
  float_status *status;
  uint32_t wt_local;
  uint32_t ws_local;
  uint32_t wd_local;
  uint32_t df_local;
  CPUMIPSState *env_local;
  
  wx.d[1] = (int64_t)&(env->active_tc).msa_fp_status;
  pfVar5 = (env->active_fpu).fpr + ws;
  pfVar6 = (env->active_fpu).fpr + wt;
  status._0_4_ = wt;
  status._4_4_ = ws;
  wt_local = wd;
  ws_local = df;
  _wd_local = env;
  clear_msacsr_cause(env);
  if (ws_local == 2) {
    iVar1 = float32_is_any_nan(pfVar5->fs[0]);
    if ((iVar1 == 0) &&
       (iVar1 = float32_is_quiet_nan_mips(pfVar6->fs[0],(float_status *)wx.d[1]), iVar1 != 0)) {
      pfVar7 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar7);
      fVar2 = float32_max_mips(pfVar5->fs[0],pfVar5->fs[0],pfVar7);
      pwx = (wr_t *)CONCAT44(pwx._4_4_,fVar2);
      uVar3 = update_msacsr(_wd_local,0,0);
      iVar1 = get_enabled_exceptions(_wd_local,uVar3);
      if (iVar1 != 0) {
        fVar2 = float32_default_nan_mips(pfVar7);
        pwx = (wr_t *)CONCAT44(pwx._4_4_,(fVar2 ^ 0x400020) & 0xffffffc0 | uVar3);
      }
    }
    else {
      iVar1 = float32_is_any_nan(pfVar6->fs[0]);
      if ((iVar1 == 0) &&
         (iVar1 = float32_is_quiet_nan_mips(pfVar5->fs[0],(float_status *)wx.d[1]), iVar1 != 0)) {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        fVar2 = float32_max_mips(pfVar6->fs[0],pfVar6->fs[0],pfVar7);
        pwx = (wr_t *)CONCAT44(pwx._4_4_,fVar2);
        uVar3 = update_msacsr(_wd_local,0,0);
        iVar1 = get_enabled_exceptions(_wd_local,uVar3);
        if (iVar1 != 0) {
          fVar2 = float32_default_nan_mips(pfVar7);
          pwx = (wr_t *)CONCAT44(pwx._4_4_,(fVar2 ^ 0x400020) & 0xffffffc0 | uVar3);
        }
      }
      else {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        fVar2 = float32_max_mips(pfVar5->fs[0],pfVar6->fs[0],pfVar7);
        pwx = (wr_t *)CONCAT44(pwx._4_4_,fVar2);
        uVar3 = update_msacsr(_wd_local,0,0);
        iVar1 = get_enabled_exceptions(_wd_local,uVar3);
        if (iVar1 != 0) {
          fVar2 = float32_default_nan_mips(pfVar7);
          pwx = (wr_t *)CONCAT44(pwx._4_4_,(fVar2 ^ 0x400020) & 0xffffffc0 | uVar3);
        }
      }
    }
    iVar1 = float32_is_any_nan(pfVar5->fs[1]);
    if ((iVar1 == 0) &&
       (iVar1 = float32_is_quiet_nan_mips(pfVar6->fs[1],(float_status *)wx.d[1]), iVar1 != 0)) {
      pfVar7 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar7);
      fVar2 = float32_max_mips(pfVar5->fs[1],pfVar5->fs[1],pfVar7);
      pwx = (wr_t *)CONCAT44(fVar2,pwx._0_4_);
      uVar3 = update_msacsr(_wd_local,0,0);
      iVar1 = get_enabled_exceptions(_wd_local,uVar3);
      if (iVar1 != 0) {
        fVar2 = float32_default_nan_mips(pfVar7);
        pwx = (wr_t *)CONCAT44((fVar2 ^ 0x400020) & 0xffffffc0 | uVar3,pwx._0_4_);
      }
    }
    else {
      iVar1 = float32_is_any_nan(pfVar6->fs[1]);
      if ((iVar1 == 0) &&
         (iVar1 = float32_is_quiet_nan_mips(pfVar5->fs[1],(float_status *)wx.d[1]), iVar1 != 0)) {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        fVar2 = float32_max_mips(pfVar6->fs[1],pfVar6->fs[1],pfVar7);
        pwx = (wr_t *)CONCAT44(fVar2,pwx._0_4_);
        uVar3 = update_msacsr(_wd_local,0,0);
        iVar1 = get_enabled_exceptions(_wd_local,uVar3);
        if (iVar1 != 0) {
          fVar2 = float32_default_nan_mips(pfVar7);
          pwx = (wr_t *)CONCAT44((fVar2 ^ 0x400020) & 0xffffffc0 | uVar3,pwx._0_4_);
        }
      }
      else {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        fVar2 = float32_max_mips(pfVar5->fs[1],pfVar6->fs[1],pfVar7);
        pwx = (wr_t *)CONCAT44(fVar2,pwx._0_4_);
        uVar3 = update_msacsr(_wd_local,0,0);
        iVar1 = get_enabled_exceptions(_wd_local,uVar3);
        if (iVar1 != 0) {
          fVar2 = float32_default_nan_mips(pfVar7);
          pwx = (wr_t *)CONCAT44((fVar2 ^ 0x400020) & 0xffffffc0 | uVar3,pwx._0_4_);
        }
      }
    }
    iVar1 = float32_is_any_nan((float32)(&pfVar5->fd)[1]);
    if ((iVar1 == 0) &&
       (iVar1 = float32_is_quiet_nan_mips((float32)(&pfVar6->fd)[1],(float_status *)wx.d[1]),
       iVar1 != 0)) {
      pfVar7 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar7);
      wx.w[0] = float32_max_mips((float32)(&pfVar5->fd)[1],(float32)(&pfVar5->fd)[1],pfVar7);
      uVar3 = update_msacsr(_wd_local,0,0);
      iVar1 = get_enabled_exceptions(_wd_local,uVar3);
      if (iVar1 != 0) {
        fVar2 = float32_default_nan_mips(pfVar7);
        wx.w[0] = (fVar2 ^ 0x400020) & 0xffffffc0 | uVar3;
      }
    }
    else {
      iVar1 = float32_is_any_nan((float32)(&pfVar6->fd)[1]);
      if ((iVar1 == 0) &&
         (iVar1 = float32_is_quiet_nan_mips((float32)(&pfVar5->fd)[1],(float_status *)wx.d[1]),
         iVar1 != 0)) {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        wx.w[0] = float32_max_mips((float32)(&pfVar6->fd)[1],(float32)(&pfVar6->fd)[1],pfVar7);
        uVar3 = update_msacsr(_wd_local,0,0);
        iVar1 = get_enabled_exceptions(_wd_local,uVar3);
        if (iVar1 != 0) {
          fVar2 = float32_default_nan_mips(pfVar7);
          wx.w[0] = (fVar2 ^ 0x400020) & 0xffffffc0 | uVar3;
        }
      }
      else {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        wx.w[0] = float32_max_mips((float32)(&pfVar5->fd)[1],(float32)(&pfVar6->fd)[1],pfVar7);
        uVar3 = update_msacsr(_wd_local,0,0);
        iVar1 = get_enabled_exceptions(_wd_local,uVar3);
        if (iVar1 != 0) {
          fVar2 = float32_default_nan_mips(pfVar7);
          wx.w[0] = (fVar2 ^ 0x400020) & 0xffffffc0 | uVar3;
        }
      }
    }
    iVar1 = float32_is_any_nan(pfVar5->fs[3]);
    if ((iVar1 == 0) &&
       (iVar1 = float32_is_quiet_nan_mips(pfVar6->fs[3],(float_status *)wx.d[1]), iVar1 != 0)) {
      pfVar7 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar7);
      fVar2 = float32_max_mips(pfVar5->fs[3],pfVar5->fs[3],pfVar7);
      wx.w[1] = fVar2;
      uVar3 = update_msacsr(_wd_local,0,0);
      iVar1 = get_enabled_exceptions(_wd_local,uVar3);
      if (iVar1 != 0) {
        fVar2 = float32_default_nan_mips(pfVar7);
        wx.w[1] = (fVar2 ^ 0x400020) & 0xffffffc0 | uVar3;
      }
    }
    else {
      iVar1 = float32_is_any_nan(pfVar6->fs[3]);
      if ((iVar1 == 0) &&
         (iVar1 = float32_is_quiet_nan_mips(pfVar5->fs[3],(float_status *)wx.d[1]), iVar1 != 0)) {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        fVar2 = float32_max_mips(pfVar6->fs[3],pfVar6->fs[3],pfVar7);
        wx.w[1] = fVar2;
        uVar3 = update_msacsr(_wd_local,0,0);
        iVar1 = get_enabled_exceptions(_wd_local,uVar3);
        if (iVar1 != 0) {
          fVar2 = float32_default_nan_mips(pfVar7);
          wx.w[1] = (fVar2 ^ 0x400020) & 0xffffffc0 | uVar3;
        }
      }
      else {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        fVar2 = float32_max_mips(pfVar5->fs[3],pfVar6->fs[3],pfVar7);
        wx.w[1] = fVar2;
        uVar3 = update_msacsr(_wd_local,0,0);
        iVar1 = get_enabled_exceptions(_wd_local,uVar3);
        if (iVar1 != 0) {
          fVar2 = float32_default_nan_mips(pfVar7);
          wx.w[1] = (fVar2 ^ 0x400020) & 0xffffffc0 | uVar3;
        }
      }
    }
  }
  else {
    if (ws_local != 3) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/mips/msa_helper.c"
                    ,0x1abd,
                    "void helper_msa_fmax_df_mips(CPUMIPSState *, uint32_t, uint32_t, uint32_t, uint32_t)"
                   );
    }
    iVar1 = float64_is_any_nan(pfVar5->fd);
    if ((iVar1 == 0) &&
       (iVar1 = float64_is_quiet_nan_mips(pfVar6->fd,(float_status *)wx.d[1]), iVar1 != 0)) {
      pfVar7 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar7);
      pwx = (wr_t *)float64_max_mips(pfVar5->fd,pfVar5->fd,pfVar7);
      iVar1 = update_msacsr(_wd_local,0,0);
      iVar4 = get_enabled_exceptions(_wd_local,iVar1);
      if (iVar4 != 0) {
        fVar8 = float64_default_nan_mips(pfVar7);
        pwx = (wr_t *)((fVar8 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1);
      }
    }
    else {
      iVar1 = float64_is_any_nan(pfVar6->fd);
      if ((iVar1 == 0) &&
         (iVar1 = float64_is_quiet_nan_mips(pfVar5->fd,(float_status *)wx.d[1]), iVar1 != 0)) {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        pwx = (wr_t *)float64_max_mips(pfVar6->fd,pfVar6->fd,pfVar7);
        iVar1 = update_msacsr(_wd_local,0,0);
        iVar4 = get_enabled_exceptions(_wd_local,iVar1);
        if (iVar4 != 0) {
          fVar8 = float64_default_nan_mips(pfVar7);
          pwx = (wr_t *)((fVar8 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1);
        }
      }
      else {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        pwx = (wr_t *)float64_max_mips(pfVar5->fd,pfVar6->fd,pfVar7);
        iVar1 = update_msacsr(_wd_local,0,0);
        iVar4 = get_enabled_exceptions(_wd_local,iVar1);
        if (iVar4 != 0) {
          fVar8 = float64_default_nan_mips(pfVar7);
          pwx = (wr_t *)((fVar8 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1);
        }
      }
    }
    iVar1 = float64_is_any_nan((&pfVar5->fd)[1]);
    if ((iVar1 == 0) &&
       (iVar1 = float64_is_quiet_nan_mips((&pfVar6->fd)[1],(float_status *)wx.d[1]), iVar1 != 0)) {
      pfVar7 = &(_wd_local->active_tc).msa_fp_status;
      set_float_exception_flags(0,pfVar7);
      wx.d[0] = float64_max_mips((&pfVar5->fd)[1],(&pfVar5->fd)[1],pfVar7);
      iVar1 = update_msacsr(_wd_local,0,0);
      iVar4 = get_enabled_exceptions(_wd_local,iVar1);
      if (iVar4 != 0) {
        fVar8 = float64_default_nan_mips(pfVar7);
        wx.d[0] = (fVar8 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1;
      }
    }
    else {
      iVar1 = float64_is_any_nan((&pfVar6->fd)[1]);
      if ((iVar1 == 0) &&
         (iVar1 = float64_is_quiet_nan_mips((&pfVar5->fd)[1],(float_status *)wx.d[1]), iVar1 != 0))
      {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        wx.d[0] = float64_max_mips((&pfVar6->fd)[1],(&pfVar6->fd)[1],pfVar7);
        iVar1 = update_msacsr(_wd_local,0,0);
        iVar4 = get_enabled_exceptions(_wd_local,iVar1);
        if (iVar4 != 0) {
          fVar8 = float64_default_nan_mips(pfVar7);
          wx.d[0] = (fVar8 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1;
        }
      }
      else {
        pfVar7 = &(_wd_local->active_tc).msa_fp_status;
        set_float_exception_flags(0,pfVar7);
        wx.d[0] = float64_max_mips((&pfVar5->fd)[1],(&pfVar6->fd)[1],pfVar7);
        iVar1 = update_msacsr(_wd_local,0,0);
        iVar4 = get_enabled_exceptions(_wd_local,iVar1);
        if (iVar4 != 0) {
          fVar8 = float64_default_nan_mips(pfVar7);
          wx.d[0] = (fVar8 ^ 0x8000000000020) & 0xffffffffffffffc0 | (long)iVar1;
        }
      }
    }
  }
  check_msacsr_cause(_wd_local,unaff_retaddr);
  msa_move_v((wr_t *)((env->active_fpu).fpr + wd),(wr_t *)&pwx);
  return;
}

Assistant:

void helper_msa_fmax_df(CPUMIPSState *env, uint32_t df, uint32_t wd,
        uint32_t ws, uint32_t wt)
{
     float_status *status = &env->active_tc.msa_fp_status;
    wr_t wx, *pwx = &wx;
    wr_t *pwd = &(env->active_fpu.fpr[wd].wr);
    wr_t *pws = &(env->active_fpu.fpr[ws].wr);
    wr_t *pwt = &(env->active_fpu.fpr[wt].wr);

    clear_msacsr_cause(env);

    if (df == DF_WORD) {

        if (NUMBER_QNAN_PAIR(pws->w[0], pwt->w[0], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pws->w[0], pws->w[0], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[0], pws->w[0], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pwt->w[0], pwt->w[0], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[0], max, pws->w[0], pwt->w[0], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[1], pwt->w[1], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pws->w[1], pws->w[1], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[1], pws->w[1], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pwt->w[1], pwt->w[1], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[1], max, pws->w[1], pwt->w[1], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[2], pwt->w[2], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pws->w[2], pws->w[2], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[2], pws->w[2], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pwt->w[2], pwt->w[2], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[2], max, pws->w[2], pwt->w[2], 32);
        }

        if (NUMBER_QNAN_PAIR(pws->w[3], pwt->w[3], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pws->w[3], pws->w[3], 32);
        } else if (NUMBER_QNAN_PAIR(pwt->w[3], pws->w[3], 32, status)) {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pwt->w[3], pwt->w[3], 32);
        } else {
            MSA_FLOAT_MAXOP(pwx->w[3], max, pws->w[3], pwt->w[3], 32);
        }

    } else if (df == DF_DOUBLE) {

        if (NUMBER_QNAN_PAIR(pws->d[0], pwt->d[0], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pws->d[0], pws->d[0], 64);
        } else if (NUMBER_QNAN_PAIR(pwt->d[0], pws->d[0], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pwt->d[0], pwt->d[0], 64);
        } else {
            MSA_FLOAT_MAXOP(pwx->d[0], max, pws->d[0], pwt->d[0], 64);
        }

        if (NUMBER_QNAN_PAIR(pws->d[1], pwt->d[1], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pws->d[1], pws->d[1], 64);
        } else if (NUMBER_QNAN_PAIR(pwt->d[1], pws->d[1], 64, status)) {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pwt->d[1], pwt->d[1], 64);
        } else {
            MSA_FLOAT_MAXOP(pwx->d[1], max, pws->d[1], pwt->d[1], 64);
        }

    } else {

        assert(0);

    }

    check_msacsr_cause(env, GETPC());

    msa_move_v(pwd, pwx);
}